

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

string * cfd::core::DescriptorKeyInfo::GetExtPubkeyInformation
                   (string *__return_storage_ptr__,ExtPubkey *ext_pubkey,string *child_path)

{
  char *pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = ExtPubkey::IsValid(ext_pubkey);
  if (bVar2) {
    ExtPubkey::GetFingerprintData((ByteData *)&local_50,ext_pubkey);
    ByteData::GetHex_abi_cxx11_(&local_38,(ByteData *)&local_50);
    ::std::operator+(&local_70,"[",&local_38);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    if (child_path->_M_string_length != 0) {
      pcVar1 = (child_path->_M_dataplus)._M_p;
      if (pcVar1[(*pcVar1 + 0xb3U & 0xdf) == 0] != '/') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::substr((ulong)&local_70,(ulong)child_path);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorKeyInfo::GetExtPubkeyInformation(
    const ExtPubkey& ext_pubkey, const std::string& child_path) {
  std::string result;
  if (ext_pubkey.IsValid()) {
    result = "[" + ext_pubkey.GetFingerprintData().GetHex();
    if (!child_path.empty()) {
      std::string::size_type index = 0;
      if ((child_path[0] == 'm') || (child_path[0] == 'M')) ++index;
      if (child_path[index] != '/') {
        result += "/";
      }
      result += child_path.substr(index);
    }
    result += "]";
  }
  return result;
}